

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::tryPumpFrom
          (HttpChunkedEntityWriter *this,AsyncInputStream *input,uint64_t amount)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar1;
  Maybe<kj::Promise<unsigned_long>_> MVar2;
  AsyncOutputStream local_38 [2];
  
  (**(code **)(*(long *)amount + 0x10))(local_38,amount);
  if ((char)local_38[0]._vptr_AsyncOutputStream == '\x01') {
    pumpImpl((HttpChunkedEntityWriter *)local_38,input,amount);
    *(undefined1 *)
     &(this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream = 1;
    (this->super_HttpEntityBodyWriter).weakInner.ptr =
         (HttpOutputStream *)local_38[0]._vptr_AsyncOutputStream;
    local_38[0]._vptr_AsyncOutputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_38);
    aVar1 = extraout_RDX_00;
  }
  else {
    *(undefined1 *)
     &(this->super_HttpEntityBodyWriter).super_AsyncOutputStream._vptr_AsyncOutputStream = 0;
    aVar1 = extraout_RDX;
  }
  MVar2.ptr.field_1 = aVar1;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar2.ptr;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input, uint64_t amount) override {
    KJ_IF_SOME(l, input.tryGetLength()) {
      return pumpImpl(input, kj::min(amount, l));
    } else {
      // Need to use naive read/write loop.
      return kj::none;
    }